

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notification.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::Notification::WaitForNotificationWithDeadline(Notification *this,Time deadline)

{
  Time deadline_00;
  ObjectKind OVar1;
  Notification *local_88;
  Condition local_58;
  byte local_31;
  Notification *pNStack_30;
  bool notified;
  Notification *this_local;
  uint32_t local_1c;
  HiRep local_14;
  Time deadline_local;
  
  local_1c = deadline.rep_.rep_lo_;
  register0x00000030 = deadline.rep_.rep_hi_;
  pNStack_30 = this;
  local_14 = register0x00000030;
  deadline_local.rep_.rep_hi_.lo_ = local_1c;
  OVar1 = TraceObjectKind();
  base_internal::TraceWait(this,OVar1);
  local_31 = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!(bool)local_31) {
    Condition::Condition<std::atomic<bool>const>
              (&local_58,HasBeenNotifiedInternal,&this->notified_yet_);
    deadline_00.rep_.rep_lo_ = deadline_local.rep_.rep_hi_.lo_;
    deadline_00.rep_.rep_hi_ = local_14;
    local_31 = Mutex::LockWhenWithDeadline(&this->mutex_,&local_58,deadline_00);
    Mutex::Unlock(&this->mutex_);
  }
  local_88 = this;
  if ((local_31 & 1) == 0) {
    local_88 = (Notification *)0x0;
  }
  OVar1 = TraceObjectKind();
  base_internal::TraceContinue(local_88,OVar1);
  return (bool)(local_31 & 1);
}

Assistant:

bool Notification::WaitForNotificationWithDeadline(absl::Time deadline) const {
  base_internal::TraceWait(this, TraceObjectKind());
  bool notified = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!notified) {
    notified = this->mutex_.LockWhenWithDeadline(
        Condition(&HasBeenNotifiedInternal, &this->notified_yet_), deadline);
    this->mutex_.Unlock();
  }
  base_internal::TraceContinue(notified ? this : nullptr, TraceObjectKind());
  return notified;
}